

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O3

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
set_cover_from_function(Cover_complex<std::vector<float,_std::allocator<float>_>_> *this)

{
  double dVar1;
  double dVar2;
  iterator iVar3;
  pointer __first;
  int iVar4;
  _Self __tmp;
  ostream *poVar5;
  vector<int,std::allocator<int>> *pvVar6;
  mapped_type_conflict1 *pmVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  pointer pdVar13;
  double *pdVar14;
  uint last;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Cover_complex<std::vector<float,_std::allocator<float>_>_> *pCVar23;
  Cover_complex<std::vector<float,_std::allocator<float>_>_> *pCVar24;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> intervals;
  vector<int,_std::allocator<int>_> points;
  int id;
  pair<double,_double> interm;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  preimages;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> funcstd;
  mutex idmutex;
  mutex covermutex;
  Cover_complex<std::vector<float,_std::allocator<float>_>_> *local_190;
  void *local_188;
  iterator iStack_180;
  pair<double,_double> *local_178;
  double local_170;
  double local_168;
  auto_partitioner local_159;
  vector<int,_std::allocator<int>_> local_158;
  int local_140;
  int local_13c;
  anon_class_56_7_c320dfda local_138;
  undefined1 local_100 [8];
  _Rb_tree_node_base _Stack_f8;
  size_t local_d8;
  long local_d0;
  Index_map local_c8;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_b8;
  __native_type local_88;
  __native_type local_58;
  
  dVar1 = this->resolution_double;
  uVar19 = SUB84(dVar1,0);
  uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
  if (((dVar1 == -1.0) && (!NAN(dVar1))) && (this->resolution_int == -1)) {
    pcVar12 = "Number and/or length of intervals not specified";
    lVar9 = 0x2f;
LAB_00106b35:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,lVar9);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    return;
  }
  if ((this->gain == -1.0) && (!NAN(this->gain))) {
    pcVar12 = "Gain not specified";
    lVar9 = 0x12;
    goto LAB_00106b35;
  }
  if ((long)this->num_points < 1) {
    local_190 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)0x47efffffe0000000;
    pCVar23 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)0xc7efffffe0000000;
  }
  else {
    uVar21 = 0xe0000000;
    uVar22 = 0xc7efffff;
    local_190 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)0x47efffffe0000000;
    lVar9 = 0;
    do {
      pCVar23 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)
                (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9];
      pCVar24 = pCVar23;
      if ((double)local_190 <= (double)pCVar23) {
        pCVar24 = local_190;
      }
      local_190 = pCVar24;
      if ((double)pCVar23 <= (double)CONCAT44(uVar22,uVar21)) {
        pCVar23 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)
                  CONCAT44(uVar22,uVar21);
      }
      lVar9 = lVar9 + 1;
      uVar21 = SUB84(pCVar23,0);
      uVar22 = (undefined4)((ulong)pCVar23 >> 0x20);
    } while (this->num_points != lVar9);
  }
  if (this->verbose != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Min function value = ",0x15);
    poVar5 = std::ostream::_M_insert<double>((double)local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," and Max function value = ",0x1a);
    poVar5 = std::ostream::_M_insert<double>((double)pCVar23);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    uVar19 = SUB84(this->resolution_double,0);
    uVar20 = (undefined4)((ulong)this->resolution_double >> 0x20);
  }
  local_188 = (void *)0x0;
  iStack_180._M_current = (pair<double,_double> *)0x0;
  local_178 = (pair<double,_double> *)0x0;
  if (((double)CONCAT44(uVar20,uVar19) == -1.0) && (!NAN((double)CONCAT44(uVar20,uVar19)))) {
    local_168 = ((double)pCVar23 - (double)local_190) / (double)this->resolution_int;
    dVar1 = this->gain;
    local_170 = (dVar1 * local_168) / (2.0 - (dVar1 + dVar1));
    local_138.preimages =
         (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)((double)local_190 + local_168 + local_170);
    local_138.this = local_190;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    _M_realloc_insert<std::pair<double,double>const&>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_188,(iterator)0x0,(pair<double,_double> *)&local_138);
    if (this->resolution_int < 3) {
      iVar4 = this->resolution_int + -1;
    }
    else {
      iVar10 = 1;
      do {
        local_100 = (undefined1  [8])(((double)iVar10 * local_168 + (double)local_190) - local_170);
        iVar10 = iVar10 + 1;
        _Stack_f8._0_8_ = (double)iVar10 * local_168 + (double)local_190 + local_170;
        if (iStack_180._M_current == local_178) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>const&>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &local_188,iStack_180,(pair<double,_double> *)local_100);
        }
        else {
          (iStack_180._M_current)->first = (double)local_100;
          (iStack_180._M_current)->second = (double)_Stack_f8._0_8_;
          iStack_180._M_current = iStack_180._M_current + 1;
        }
        iVar4 = this->resolution_int + -1;
      } while (iVar10 < iVar4);
    }
    local_100 = (undefined1  [8])(((double)iVar4 * local_168 + (double)local_190) - local_170);
    _Stack_f8._0_8_ = pCVar23;
    if (iStack_180._M_current == local_178) {
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>const&>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_188,iStack_180,(pair<double,_double> *)local_100);
    }
    else {
      (iStack_180._M_current)->first = (double)local_100;
      (iStack_180._M_current)->second = (double)pCVar23;
      iStack_180._M_current = iStack_180._M_current + 1;
    }
    last = (uint)((ulong)((long)iStack_180._M_current - (long)local_188) >> 4);
    if ((this->verbose == true) && (0 < (int)last)) {
      lVar9 = 0;
      uVar15 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Interval ",9);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = [",4);
        poVar5 = std::ostream::_M_insert<double>(*(double *)((long)local_188 + lVar9));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::ostream::_M_insert<double>(*(double *)((long)local_188 + lVar9 + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        uVar15 = uVar15 + 1;
        lVar9 = lVar9 + 0x10;
      } while ((last & 0x7fffffff) != uVar15);
    }
    goto LAB_0010710b;
  }
  pCVar24 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)
            ((double)local_190 + (double)CONCAT44(uVar20,uVar19));
  if (this->resolution_int != -1) {
    last = 0;
    if ((0 < this->resolution_int) && ((double)pCVar24 <= (double)pCVar23)) {
      uVar21 = SUB84(this->gain,0);
      uVar22 = (undefined4)((ulong)this->gain >> 0x20);
      iVar4 = 1;
      do {
        if ((double)pCVar23 -
            ((double)pCVar24 - (double)CONCAT44(uVar22,uVar21) * (double)CONCAT44(uVar20,uVar19)) <
            (double)CONCAT44(uVar20,uVar19)) break;
        local_138.this = local_190;
        local_138.preimages =
             (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)pCVar24;
        if (iStack_180._M_current == local_178) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>const&>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &local_188,iStack_180,(pair<double,_double> *)&local_138);
        }
        else {
          (iStack_180._M_current)->first = (double)local_190;
          (iStack_180._M_current)->second = (double)pCVar24;
          iStack_180._M_current = iStack_180._M_current + 1;
        }
        if (this->resolution_int <= iVar4) break;
        dVar1 = this->resolution_double;
        uVar19 = SUB84(dVar1,0);
        uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar2 = this->gain;
        uVar21 = SUB84(dVar2,0);
        uVar22 = (undefined4)((ulong)dVar2 >> 0x20);
        local_190 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)
                    ((double)pCVar24 - dVar2 * dVar1);
        pCVar24 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)
                  (dVar1 + (double)local_190);
        iVar4 = iVar4 + 1;
      } while ((double)pCVar24 <= (double)pCVar23);
      last = (uint)((ulong)((long)iStack_180._M_current - (long)local_188) >> 4);
      if ((this->verbose == true) && (0 < (int)last)) {
        lVar9 = 0;
        uVar15 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Interval ",9);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,(int)uVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," = [",4);
          poVar5 = std::ostream::_M_insert<double>(*(double *)((long)local_188 + lVar9));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = std::ostream::_M_insert<double>(*(double *)((long)local_188 + lVar9 + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          uVar15 = uVar15 + 1;
          lVar9 = lVar9 + 0x10;
        } while ((last & 0x7fffffff) != uVar15);
      }
    }
    goto LAB_0010710b;
  }
  if ((double)pCVar24 <= (double)pCVar23) {
    uVar21 = SUB84(this->gain,0);
    uVar22 = (undefined4)((ulong)this->gain >> 0x20);
    do {
      if ((double)pCVar23 -
          ((double)pCVar24 - (double)CONCAT44(uVar22,uVar21) * (double)CONCAT44(uVar20,uVar19)) <
          (double)CONCAT44(uVar20,uVar19)) break;
      local_138.this = local_190;
      if (iStack_180._M_current == local_178) {
        local_138.preimages =
             (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)pCVar24;
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        _M_realloc_insert<std::pair<double,double>const&>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &local_188,iStack_180,(pair<double,_double> *)&local_138);
      }
      else {
        (iStack_180._M_current)->first = (double)local_190;
        (iStack_180._M_current)->second = (double)pCVar24;
        iStack_180._M_current = iStack_180._M_current + 1;
      }
      dVar1 = this->resolution_double;
      uVar19 = SUB84(dVar1,0);
      uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar2 = this->gain;
      uVar21 = SUB84(dVar2,0);
      uVar22 = (undefined4)((ulong)dVar2 >> 0x20);
      local_190 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)
                  ((double)pCVar24 - dVar2 * dVar1);
      pCVar24 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)
                (dVar1 + (double)local_190);
    } while ((double)pCVar24 <= (double)pCVar23);
    local_138.this = local_190;
    if (iStack_180._M_current == local_178) goto LAB_00107824;
    (iStack_180._M_current)->first = (double)local_190;
    (iStack_180._M_current)->second = (double)pCVar23;
    iStack_180._M_current = iStack_180._M_current + 1;
    local_138.preimages =
         (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)pCVar23;
  }
  else {
LAB_00107824:
    local_138.this = local_190;
    local_138.preimages =
         (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)pCVar23;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    _M_realloc_insert<std::pair<double,double>const&>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_188,iStack_180,(pair<double,_double> *)&local_138);
  }
  last = (uint)((ulong)((long)iStack_180._M_current - (long)local_188) >> 4);
  if ((this->verbose == true) && (0 < (int)last)) {
    lVar9 = 0;
    uVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Interval ",9);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,(int)uVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = [",4);
      poVar5 = std::ostream::_M_insert<double>(*(double *)((long)local_188 + lVar9));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::ostream::_M_insert<double>(*(double *)((long)local_188 + lVar9 + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      uVar15 = uVar15 + 1;
      lVar9 = lVar9 + 0x10;
    } while ((last & 0x7fffffff) != uVar15);
  }
LAB_0010710b:
  std::vector<int,_std::allocator<int>_>::vector
            (&local_158,(long)this->num_points,(allocator_type *)&local_138);
  __first = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (0 < this->num_points) {
    lVar9 = 0;
    do {
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] = (int)lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->num_points);
  }
  if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar15 = (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar9 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::cover_complex::Cover_complex<std::vector<float,std::allocator<float>>>::set_cover_from_function()::_lambda(int,int)_1_>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Nerve_GIC_include_gudhi_GIC_h:688:45)>
                )this);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::cover_complex::Cover_complex<std::vector<float,std::allocator<float>>>::set_cover_from_function()::_lambda(int,int)_1_>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Nerve_GIC_include_gudhi_GIC_h:688:45)>
                )this);
  }
  local_140 = 0;
  local_c8.m_g = &this->one_skeleton;
  local_c8.m_tag = vertex_index;
  _Stack_f8._M_left = &_Stack_f8;
  _Stack_f8._0_8_ = _Stack_f8._0_8_ & 0xffffffff00000000;
  _Stack_f8._M_parent = (_Base_ptr)0x0;
  local_d8 = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_f8._M_right = _Stack_f8._M_left;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Computing preimages...",0x16);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  local_138.this =
       (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)
       ((ulong)local_138.this & 0xffffffff00000000);
  if (0 < (int)last) {
    iVar4 = last - 1;
    iVar11 = 0;
    local_d0 = (long)iVar4 << 4;
    iVar10 = 0;
    local_13c = iVar4;
    do {
      local_170 = *(double *)((long)local_188 + (long)iVar10 * 0x10 + 8);
      if (iVar10 == iVar4) {
        local_190 = *(Cover_complex<std::vector<float,_std::allocator<float>_>_> **)
                     ((long)local_188 + local_d0 + -8);
        pdVar14 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar11];
        iVar10 = this->num_points;
        iVar16 = iVar11;
        if ((*pdVar14 <= (double)local_190 && (double)local_190 != *pdVar14) && (iVar11 != iVar10))
        {
          lVar9 = (long)iVar11 << 2;
          do {
            pvVar6 = (vector<int,std::allocator<int>> *)
                     std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)local_100,(key_type *)&local_138);
            iVar3._M_current = *(int **)(pvVar6 + 8);
            if (iVar3._M_current == *(int **)(pvVar6 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar6,iVar3,
                         (int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar9));
            }
            else {
              *iVar3._M_current =
                   *(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar9);
              *(int **)(pvVar6 + 8) = iVar3._M_current + 1;
            }
            iVar16 = iVar16 + 1;
            pdVar14 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      *(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start + lVar9 + 4);
            iVar10 = this->num_points;
          } while ((*pdVar14 <= (double)local_190 && (double)local_190 != *pdVar14) &&
                  (lVar9 = lVar9 + 4, iVar16 != iVar10));
        }
        if (iVar16 != iVar10) {
          lVar9 = (long)iVar16 << 2;
          do {
            pvVar6 = (vector<int,std::allocator<int>> *)
                     std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)local_100,(key_type *)&local_138);
            iVar3._M_current = *(int **)(pvVar6 + 8);
            if (iVar3._M_current == *(int **)(pvVar6 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar6,iVar3,
                         (int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar9));
            }
            else {
              *iVar3._M_current =
                   *(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar9);
              *(int **)(pvVar6 + 8) = iVar3._M_current + 1;
            }
            lVar9 = lVar9 + 4;
            iVar16 = iVar16 + 1;
          } while (iVar16 != this->num_points);
        }
        local_168 = local_170;
      }
      else {
        pdVar14 = (double *)((long)iVar10 * 0x10 + (long)local_188);
        pdVar13 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar16 = this->num_points;
        if (iVar10 == 0) {
          local_190 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)*pdVar14;
          iVar10 = 0;
        }
        else {
          local_190 = (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)pdVar14[-1];
          if ((pdVar13[local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar11]] <= (double)local_190 &&
               (double)local_190 !=
               pdVar13[local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar11]]) && (iVar11 != iVar16)) {
            lVar9 = (long)iVar11 << 2;
            do {
              pvVar6 = (vector<int,std::allocator<int>> *)
                       std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                     *)local_100,(key_type *)&local_138);
              iVar3._M_current = *(int **)(pvVar6 + 8);
              if (iVar3._M_current == *(int **)(pvVar6 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (pvVar6,iVar3,
                           (int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar9));
              }
              else {
                *iVar3._M_current =
                     *(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar9);
                *(int **)(pvVar6 + 8) = iVar3._M_current + 1;
              }
              pdVar13 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar11 = iVar11 + 1;
              iVar16 = this->num_points;
            } while ((pdVar13[*(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar9 + 4)]
                      <= (double)local_190 &&
                      (double)local_190 !=
                      pdVar13[*(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar9 + 4)]
                     ) && (lVar9 = lVar9 + 4, iVar11 != iVar16));
            iVar10 = (int)local_138.this;
          }
        }
        local_168 = *(double *)((long)local_188 + (long)iVar10 * 0x10 + 0x10);
        lVar9 = (long)iVar11;
        dVar1 = pdVar13[local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar9]];
        uVar19 = SUB84(dVar1,0);
        uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
        if ((dVar1 < local_168) && (iVar11 != iVar16)) {
          lVar18 = lVar9 * 4;
          lVar17 = lVar9 << 0x20;
          do {
            pvVar6 = (vector<int,std::allocator<int>> *)
                     std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)local_100,(key_type *)&local_138);
            iVar3._M_current = *(int **)(pvVar6 + 8);
            if (iVar3._M_current == *(int **)(pvVar6 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar6,iVar3,
                         (int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar18));
            }
            else {
              *iVar3._M_current =
                   *(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar18);
              *(int **)(pvVar6 + 8) = iVar3._M_current + 1;
            }
            pdVar13 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar11 = iVar11 + 1;
            lVar17 = lVar17 + 0x100000000;
            pdVar14 = pdVar13 + *(int *)((long)local_158.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + lVar18 + 4);
            iVar16 = this->num_points;
          } while ((*pdVar14 <= local_168 && local_168 != *pdVar14) &&
                  (lVar18 = lVar18 + 4, iVar11 != iVar16));
          lVar9 = lVar17 >> 0x20;
          dVar1 = pdVar13[*(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start + (lVar17 >> 0x1e)
                                  )];
          uVar19 = SUB84(dVar1,0);
          uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
          iVar4 = local_13c;
        }
        if (((double)CONCAT44(uVar20,uVar19) <= local_170 &&
             local_170 != (double)CONCAT44(uVar20,uVar19)) && (iVar11 != iVar16)) {
          lVar18 = lVar9 * 4;
          iVar10 = (int)lVar9;
          do {
            iVar10 = iVar10 + 1;
            pvVar6 = (vector<int,std::allocator<int>> *)
                     std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)local_100,(key_type *)&local_138);
            iVar3._M_current = *(int **)(pvVar6 + 8);
            if (iVar3._M_current == *(int **)(pvVar6 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar6,iVar3,
                         (int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar18));
            }
            else {
              *iVar3._M_current =
                   *(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar18);
              *(int **)(pvVar6 + 8) = iVar3._M_current + 1;
            }
            pdVar14 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      *(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start + lVar18 + 4);
          } while ((*pdVar14 <= local_170 && local_170 != *pdVar14) &&
                  (lVar18 = lVar18 + 4, iVar10 != this->num_points));
        }
      }
      pmVar7 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_b8,(key_type *)&local_138);
      *pmVar7 = ((double)local_190 + local_168) * 0.5;
      iVar10 = (int)local_138.this + 1;
      local_138.this =
           (Cover_complex<std::vector<float,_std::allocator<float>_>_> *)
           CONCAT44(local_138.this._4_4_,iVar10);
    } while (iVar10 < (int)last);
  }
  if (this->verbose != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Computing connected components (parallelized)...",0x30);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  local_138.covermutex = (mutex *)&local_58;
  local_58._16_8_ = 0;
  local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_58.__align = 0;
  local_58._8_8_ = 0;
  local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_138.idmutex = (mutex *)&local_88;
  local_88.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_88._16_8_ = 0;
  local_88.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_88.__align = 0;
  local_88._8_8_ = 0;
  local_138.preimages =
       (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
        *)local_100;
  local_138.index = &local_c8;
  local_138.funcstd =
       (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)&local_b8
  ;
  local_138.id = &local_140;
  local_138.this = this;
  tbb::detail::d1::
  parallel_for_impl<int,Gudhi::cover_complex::Cover_complex<std::vector<float,std::allocator<float>>>::set_cover_from_function()::_lambda(int)_1_,tbb::detail::d1::auto_partitioner_const>
            (0,last,1,&local_138,&local_159);
  this->maximal_dim = local_140 + -1;
  for (p_Var8 = (this->cover_color)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(this->cover_color)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    p_Var8[1]._M_left =
         (_Base_ptr)((double)p_Var8[1]._M_left / (double)*(int *)&p_Var8[1]._M_parent);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_b8);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)local_100);
  if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188,(long)local_178 - (long)local_188);
  }
  return;
}

Assistant:

void set_cover_from_function() {
    if (resolution_double == -1 && resolution_int == -1) {
      std::cerr << "Number and/or length of intervals not specified" << std::endl;
      return;
    }
    if (gain == -1) {
      std::cerr << "Gain not specified" << std::endl;
      return;
    }

    // Read function values and compute min and max
    double minf = (std::numeric_limits<float>::max)();
    double maxf = std::numeric_limits<float>::lowest();
    for (int i = 0; i < this->num_points; i++) {
      minf = (std::min)(minf, func[i]);
      maxf = (std::max)(maxf, func[i]);
    }
    if (verbose) std::clog << "Min function value = " << minf << " and Max function value = " << maxf << std::endl;

    // Compute cover of im(f)
    std::vector<std::pair<double, double> > intervals;
    int res;

    if (resolution_double == -1) {  // Case we use an integer for the number of intervals.
      double incr = (maxf - minf) / resolution_int;
      double x = minf;
      double alpha = (incr * gain) / (2 - 2 * gain);
      double y = minf + incr + alpha;
      std::pair<double, double> interm(x, y);
      intervals.push_back(interm);
      for (int i = 1; i < resolution_int - 1; i++) {
        x = minf + i * incr - alpha;
        y = minf + (i + 1) * incr + alpha;
        std::pair<double, double> inter(x, y);
        intervals.push_back(inter);
      }
      x = minf + (resolution_int - 1) * incr - alpha;
      y = maxf;
      std::pair<double, double> interM(x, y);
      intervals.push_back(interM);
      res = intervals.size();
      if (verbose) {
        for (int i = 0; i < res; i++)
          std::clog << "Interval " << i << " = [" << intervals[i].first << ", " << intervals[i].second << "]"
                    << std::endl;
      }
    } else {
      if (resolution_int == -1) {  // Case we use a double for the length of the intervals.
        double x = minf;
        double y = x + resolution_double;
        while (y <= maxf && maxf - (y - gain * resolution_double) >= resolution_double) {
          std::pair<double, double> inter(x, y);
          intervals.push_back(inter);
          x = y - gain * resolution_double;
          y = x + resolution_double;
        }
        std::pair<double, double> interM(x, maxf);
        intervals.push_back(interM);
        res = intervals.size();
        if (verbose) {
          for (int i = 0; i < res; i++)
            std::clog << "Interval " << i << " = [" << intervals[i].first << ", " << intervals[i].second << "]"
                      << std::endl;
        }
      } else {  // Case we use an integer and a double for the length of the intervals.
        double x = minf;
        double y = x + resolution_double;
        int count = 0;
        while (count < resolution_int && y <= maxf && maxf - (y - gain * resolution_double) >= resolution_double) {
          std::pair<double, double> inter(x, y);
          intervals.push_back(inter);
          count++;
          x = y - gain * resolution_double;
          y = x + resolution_double;
        }
        res = intervals.size();
        if (verbose) {
          for (int i = 0; i < res; i++)
            std::clog << "Interval " << i << " = [" << intervals[i].first << ", " << intervals[i].second << "]"
                      << std::endl;
        }
      }
    }

    // Sort points according to function values
    std::vector<int> points(this->num_points);
    for (int i = 0; i < this->num_points; i++) points[i] = i;
    std::sort(points.begin(), points.end(), [this](int p1, int p2){return (this->func[p1] < this->func[p2]);});

    int id = 0;
    int pos = 0;
    Index_map index = boost::get(boost::vertex_index, one_skeleton);  // int maxc = -1;
    std::map<int, std::vector<int> > preimages;
    std::map<int, double> funcstd;

    if (verbose) std::clog << "Computing preimages..." << std::endl;
    for (int i = 0; i < res; i++) {
      // Find points in the preimage
      std::pair<double, double> inter1 = intervals[i];
      int tmp = pos;
      double u, v;

      if (i != res - 1) {
        if (i != 0) {
          std::pair<double, double> inter3 = intervals[i - 1];
          while (func[points[tmp]] < inter3.second && tmp != this->num_points) {
            preimages[i].push_back(points[tmp]);
            tmp++;
          }
          u = inter3.second;
        } else {
          u = inter1.first;
        }

        std::pair<double, double> inter2 = intervals[i + 1];
        while (func[points[tmp]] < inter2.first && tmp != this->num_points) {
          preimages[i].push_back(points[tmp]);
          tmp++;
        }
        v = inter2.first;
        pos = tmp;
        while (func[points[tmp]] < inter1.second && tmp != this->num_points) {
          preimages[i].push_back(points[tmp]);
          tmp++;
        }

      } else {
        std::pair<double, double> inter3 = intervals[i - 1];
        while (func[points[tmp]] < inter3.second && tmp != this->num_points) {
          preimages[i].push_back(points[tmp]);
          tmp++;
        }
        while (tmp != this->num_points) {
          preimages[i].push_back(points[tmp]);
          tmp++;
        }
        u = inter3.second;
        v = inter1.second;
      }

      funcstd[i] = 0.5 * (u + v);
    }

    #ifdef GUDHI_USE_TBB
      if (verbose) std::clog << "Computing connected components (parallelized)..." << std::endl;
      std::mutex covermutex, idmutex;
      tbb::parallel_for(0, res, [&](int i){
        // Compute connected components
        Graph G = one_skeleton.create_subgraph();
        int num = preimages[i].size();
        std::vector<int> component(num);
        for (int j = 0; j < num; j++) boost::add_vertex(index[vertices[preimages[i][j]]], G);
        boost::connected_components(G, &component[0]);
        int max = 0;

        // For each point in preimage
        for (int j = 0; j < num; j++) {
          // Update number of components in preimage
          if (component[j] > max) max = component[j];

          // Identify component with Cantor polynomial N^2 -> N
          int identifier = ((i + component[j])*(i + component[j]) + 3 * i + component[j]) / 2;

          // Update covers
          covermutex.lock();
          cover[preimages[i][j]].push_back(identifier);
          cover_back[identifier].push_back(preimages[i][j]);
          cover_fct[identifier] = i;
          cover_std[identifier] = funcstd[i];
          cover_color[identifier].second += func_color[preimages[i][j]];
          cover_color[identifier].first += 1;
          covermutex.unlock();
        }

        // Maximal dimension is total number of connected components
        idmutex.lock();
        id += max + 1;
        idmutex.unlock();
      });
    #else
      if (verbose) std::clog << "Computing connected components..." << std::endl;
      for (int i = 0; i < res; i++) {
        // Compute connected components
        Graph G = one_skeleton.create_subgraph();
        int num = preimages[i].size();
        std::vector<int> component(num);
        for (int j = 0; j < num; j++) boost::add_vertex(index[vertices[preimages[i][j]]], G);
        boost::connected_components(G, &component[0]);
        int max = 0;

        // For each point in preimage
        for (int j = 0; j < num; j++) {
          // Update number of components in preimage
          if (component[j] > max) max = component[j];

          // Identify component with Cantor polynomial N^2 -> N
          int identifier = (std::pow(i + component[j], 2) + 3 * i + component[j]) / 2;

          // Update covers
          cover[preimages[i][j]].push_back(identifier);
          cover_back[identifier].push_back(preimages[i][j]);
          cover_fct[identifier] = i;
          cover_std[identifier] = funcstd[i];
          cover_color[identifier].second += func_color[preimages[i][j]];
          cover_color[identifier].first += 1;
        }

        // Maximal dimension is total number of connected components
        id += max + 1;
      }
    #endif

    maximal_dim = id - 1;
    for (std::map<int, std::pair<int, double> >::iterator iit = cover_color.begin(); iit != cover_color.end(); iit++)
      iit->second.second /= iit->second.first;
  }